

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfmt.hpp
# Opt level: O0

string * __thiscall
cpptrace::microfmt::detail::format<4ul,char_const*>
          (string *__return_storage_ptr__,detail *this,char *fmt_begin,char *fmt_end,
          array<cpptrace::microfmt::detail::format_value,_4UL> args)

{
  char cVar1;
  bool bVar2;
  undefined1 local_a8 [8];
  anon_class_56_7_8906807c handle_formatter;
  char *saved_it;
  char ***local_58;
  anon_class_16_2_b3e63829 read_number;
  anon_class_16_2_dcdac0d9 peek;
  char *it;
  size_t arg_i;
  char **local_20;
  char *fmt_end_local;
  char *fmt_begin_local;
  string *str;
  
  arg_i._7_1_ = 0;
  local_20 = (char **)fmt_begin;
  fmt_end_local = (char *)this;
  fmt_begin_local = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  it = (char *)0x0;
  peek.it = (char **)fmt_end_local;
  read_number.fmt_end = (char **)&stack0xffffffffffffffe0;
  peek.fmt_end = (char **)&peek.it;
  local_58 = &peek.it;
  read_number.it = (char **)&stack0xffffffffffffffe0;
  do {
    if (peek.it == local_20) {
      return __return_storage_ptr__;
    }
    if (((*(char *)peek.it == '{') || (*(char *)peek.it == '}')) &&
       (cVar1 = format<4UL,_const_char_*>::anon_class_16_2_dcdac0d9::operator()
                          ((anon_class_16_2_dcdac0d9 *)&read_number.fmt_end,1),
       cVar1 == *(char *)peek.it)) {
      peek.it = (char **)((long)peek.it + 1);
LAB_0026b786:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,*(char *)peek.it);
    }
    else {
      if ((*(char *)peek.it != '{') || ((char **)((long)peek.it + 1) == local_20))
      goto LAB_0026b786;
      handle_formatter.str = (string *)peek.it;
      local_a8 = (undefined1  [8])&peek.it;
      handle_formatter.it = (char **)&local_58;
      handle_formatter.read_number = (anon_class_16_2_b3e63829 *)&stack0xffffffffffffffe0;
      handle_formatter.fmt_end = (char **)&read_number.fmt_end;
      handle_formatter.peek = (anon_class_16_2_dcdac0d9 *)&it;
      handle_formatter.arg_i = (size_t *)&args;
      handle_formatter.args =
           (array<cpptrace::microfmt::detail::format_value,_4UL> *)__return_storage_ptr__;
      bVar2 = format<4UL,_const_char_*>::anon_class_56_7_8906807c::operator()
                        ((anon_class_56_7_8906807c *)local_a8);
      if (!bVar2) {
        peek.it = (char **)handle_formatter.str;
        goto LAB_0026b786;
      }
    }
    peek.it = (char **)((long)peek.it + 1);
  } while( true );
}

Assistant:

std::string format(It fmt_begin, It fmt_end, std::array<format_value, N> args) {
            std::string str;
            std::size_t arg_i = 0;
            auto it = fmt_begin;
            auto peek = [&] (std::size_t dist) -> char { // 0 on failure
                return fmt_end - it > signed(dist) ? *(it + dist) : 0;
            };
            auto read_number = [&] () -> int { // -1 on failure
                auto scan = it;
                int num = 0;
                while(scan != fmt_end && isdigit(*scan)) {
                    num *= 10;
                    num += *scan - '0';
                    scan++;
                }
                if(scan != it) {
                    it = scan;
                    return num;
                } else {
                    return -1;
                }
            };
            for(; it != fmt_end; it++) {
                if((*it == '{' || *it == '}') && peek(1) == *it) { // parse {{ and }} escapes
                    it++;
                } else if(*it == '{' && it + 1 != fmt_end) {
                    auto saved_it = it;
                    auto handle_formatter = [&] () {
                        it++;
                        format_options options;
                        // try to parse alignment
                        if(*it == '<' || *it == '>') {
                            options.align = *it++ == '<' ? alignment::left : alignment::right;
                        }
                        // try to parse width
                        auto width = read_number(); // handles fmt_end check
                        if(width != -1) {
                            options.width = width;
                        } else if(it != fmt_end && *it == '{') { // try to parse variable width
                            if(peek(1) != '}') {
                                return false;
                            }
                            it += 2;
                            options.width = arg_i < args.size() ? args[arg_i++].unwrap_int() : 0;
                        }
                        // try to parse fill/base
                        if(it != fmt_end && *it == ':') {
                            it++;
                            if(fmt_end - it > 1 && *it != '}' && peek(1) != '}') { // two chars before the }, fill+base
                                options.fill = *it++;
                                options.base = *it++;
                            } else if(it != fmt_end && *it != '}') { // one char before the }, just base
                                if(*it == 'd' || *it == 'h' || *it == 'H' || *it == 'o' || *it == 'b') {
                                    options.base = *it++;
                                } else {
                                    options.fill = *it++;
                                }
                            }
                        }
                        if(it == fmt_end || *it != '}') {
                            return false;
                        }
                        if(arg_i < args.size()) {
                            args[arg_i++].write(str, options);
                        }
                        return true;
                    };
                    if(handle_formatter()) {
                        continue; // If reached here, successfully parsed and wrote a formatter. Don't write *it.
                    }
                    it = saved_it; // go back
                }
                str += *it;
            }
            return str;
        }